

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O0

void __thiscall
cfd::core::ExtPubkey::ExtPubkey
          (ExtPubkey *this,NetType network_type,Pubkey *parent_key,ByteData256 *parent_chain_code,
          uint8_t parent_depth,uint32_t child_num)

{
  pointer *__dest;
  bool bVar1;
  CfdException *pCVar2;
  uchar *puVar3;
  size_type sVar4;
  ByteData256 local_3a0;
  ByteData local_388;
  undefined1 local_36a;
  allocator local_369;
  string local_368;
  CfdSourceLocation local_348;
  allocator<unsigned_char> local_329;
  undefined1 local_328 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  string local_308;
  CfdSourceLocation local_2e8;
  int local_2cc;
  undefined8 uStack_2c8;
  int ret;
  ext_key extkey;
  ByteData local_200;
  undefined1 local_1e8 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> chain_bytes;
  undefined1 local_1b8 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> pubkey_hash;
  undefined1 local_188 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> pubkey_bytes;
  ext_key parent;
  undefined1 local_98 [8];
  Pubkey key;
  string local_78;
  CfdSourceLocation local_58;
  uint32_t local_30;
  uint8_t local_29;
  uint32_t child_num_local;
  uint8_t parent_depth_local;
  ByteData256 *parent_chain_code_local;
  Pubkey *parent_key_local;
  ExtPubkey *pEStack_10;
  NetType network_type_local;
  ExtPubkey *this_local;
  
  local_30 = child_num;
  local_29 = parent_depth;
  _child_num_local = parent_chain_code;
  parent_chain_code_local = (ByteData256 *)parent_key;
  parent_key_local._4_4_ = network_type;
  pEStack_10 = this;
  ByteData::ByteData(&this->serialize_data_);
  this->version_ = 0;
  this->fingerprint_ = 0;
  this->depth_ = '\0';
  this->child_num_ = 0;
  ByteData256::ByteData256(&this->chaincode_);
  Pubkey::Pubkey(&this->pubkey_);
  ByteData256::ByteData256(&this->tweak_sum_);
  bVar1 = Pubkey::IsValid((Pubkey *)parent_chain_code_local);
  if (!bVar1) {
    local_58.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_hdwallet.cpp"
                 ,0x2f);
    local_58.filename = local_58.filename + 1;
    local_58.line = 0x339;
    local_58.funcname = "ExtPubkey";
    logger::warn<>(&local_58,"invalid pubkey.");
    key.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_78,"Failed to pubkey. ExtPubkey invalid pubkey.",
               (allocator *)
               ((long)&key.data_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,&local_78);
    key.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  Pubkey::Pubkey((Pubkey *)local_98,(Pubkey *)parent_chain_code_local);
  bVar1 = Pubkey::IsCompress((Pubkey *)local_98);
  if (!bVar1) {
    Pubkey::Compress((Pubkey *)(parent.pub_key_tweak_sum + 0x18),(Pubkey *)local_98);
    Pubkey::operator=((Pubkey *)local_98,(Pubkey *)(parent.pub_key_tweak_sum + 0x18));
    Pubkey::~Pubkey((Pubkey *)(parent.pub_key_tweak_sum + 0x18));
  }
  memset(&pubkey_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage,0,0xc0);
  memset(&pubkey_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage,0,0xc0);
  builtin_memcpy(parent.hash160 + 0xc,"χ5\x04",4);
  if ((parent_key_local._4_4_ == kMainnet) || (parent_key_local._4_4_ == kLiquidV1)) {
    parent.hash160[0xc] = '\x1e';
    parent.hash160[0xd] = 0xb2;
    parent.hash160[0xe] = 0x88;
    parent.hash160[0xf] = '\x04';
  }
  parent.parent160[0xc] = local_29;
  parent.pad1[2] = '\x01';
  Pubkey::GetData((ByteData *)
                  &pubkey_hash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage,(Pubkey *)local_98);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_188,
                     (ByteData *)
                     &pubkey_hash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  ByteData::~ByteData((ByteData *)
                      &pubkey_hash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  HashUtil::Hash160((ByteData160 *)
                    &chain_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,(Pubkey *)local_98);
  ByteData160::GetBytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1b8,
             (ByteData160 *)
             &chain_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  ByteData160::~ByteData160
            ((ByteData160 *)
             &chain_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  ByteData256::GetData(&local_200,_child_num_local);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1e8,&local_200);
  ByteData::~ByteData(&local_200);
  puVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_188);
  sVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_188);
  memcpy(parent.hash160 + 0x13,puVar3,sVar4);
  puVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1b8);
  sVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1b8);
  memcpy(parent.priv_key + 0x1d,puVar3,sVar4);
  puVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1e8);
  sVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1e8);
  __dest = &pubkey_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  memcpy(__dest,puVar3,sVar4);
  extkey.pub_key_tweak_sum[8] = '\0';
  extkey.pub_key_tweak_sum[9] = '\0';
  extkey.pub_key_tweak_sum[10] = '\0';
  extkey.pub_key_tweak_sum[0xb] = '\0';
  extkey.pub_key_tweak_sum[0xc] = '\0';
  extkey.pub_key_tweak_sum[0xd] = '\0';
  extkey.pub_key_tweak_sum[0xe] = '\0';
  extkey.pub_key_tweak_sum[0xf] = '\0';
  extkey.pub_key_tweak_sum[0x10] = '\0';
  extkey.pub_key_tweak_sum[0x11] = '\0';
  extkey.pub_key_tweak_sum[0x12] = '\0';
  extkey.pub_key_tweak_sum[0x13] = '\0';
  extkey.pub_key_tweak_sum[0x14] = '\0';
  extkey.pub_key_tweak_sum[0x15] = '\0';
  extkey.pub_key_tweak_sum[0x16] = '\0';
  extkey.pub_key_tweak_sum[0x17] = '\0';
  extkey.pub_key[0x19] = '\0';
  extkey.pub_key[0x1a] = '\0';
  extkey.pub_key[0x1b] = '\0';
  extkey.pub_key[0x1c] = '\0';
  extkey.pub_key[0x1d] = '\0';
  extkey.pub_key[0x1e] = '\0';
  extkey.pub_key[0x1f] = '\0';
  extkey.pub_key[0x20] = '\0';
  extkey.pub_key_tweak_sum[0] = '\0';
  extkey.pub_key_tweak_sum[1] = '\0';
  extkey.pub_key_tweak_sum[2] = '\0';
  extkey.pub_key_tweak_sum[3] = '\0';
  extkey.pub_key_tweak_sum[4] = '\0';
  extkey.pub_key_tweak_sum[5] = '\0';
  extkey.pub_key_tweak_sum[6] = '\0';
  extkey.pub_key_tweak_sum[7] = '\0';
  extkey.pub_key[9] = '\0';
  extkey.pub_key[10] = '\0';
  extkey.pub_key[0xb] = '\0';
  extkey.pub_key[0xc] = '\0';
  extkey.pub_key[0xd] = '\0';
  extkey.pub_key[0xe] = '\0';
  extkey.pub_key[0xf] = '\0';
  extkey.pub_key[0x10] = '\0';
  extkey.pub_key[0x11] = '\0';
  extkey.pub_key[0x12] = '\0';
  extkey.pub_key[0x13] = '\0';
  extkey.pub_key[0x14] = '\0';
  extkey.pub_key[0x15] = '\0';
  extkey.pub_key[0x16] = '\0';
  extkey.pub_key[0x17] = '\0';
  extkey.pub_key[0x18] = '\0';
  extkey.version = 0;
  extkey.pad2[0] = '\0';
  extkey.pad2[1] = '\0';
  extkey.pad2[2] = '\0';
  extkey.pub_key[0] = '\0';
  extkey.pub_key[1] = '\0';
  extkey.pub_key[2] = '\0';
  extkey.pub_key[3] = '\0';
  extkey.pub_key[4] = '\0';
  extkey.pub_key[5] = '\0';
  extkey.pub_key[6] = '\0';
  extkey.pub_key[7] = '\0';
  extkey.pub_key[8] = '\0';
  extkey.hash160[4] = '\0';
  extkey.hash160[5] = '\0';
  extkey.hash160[6] = '\0';
  extkey.hash160[7] = '\0';
  extkey.hash160[8] = '\0';
  extkey.hash160[9] = '\0';
  extkey.hash160[10] = '\0';
  extkey.hash160[0xb] = '\0';
  extkey.hash160[0xc] = '\0';
  extkey.hash160[0xd] = '\0';
  extkey.hash160[0xe] = '\0';
  extkey.hash160[0xf] = '\0';
  extkey.hash160[0x10] = '\0';
  extkey.hash160[0x11] = '\0';
  extkey.hash160[0x12] = '\0';
  extkey.hash160[0x13] = '\0';
  extkey.priv_key[0x19] = '\0';
  extkey.priv_key[0x1a] = '\0';
  extkey.priv_key[0x1b] = '\0';
  extkey.priv_key[0x1c] = '\0';
  extkey.priv_key[0x1d] = '\0';
  extkey.priv_key[0x1e] = '\0';
  extkey.priv_key[0x1f] = '\0';
  extkey.priv_key[0x20] = '\0';
  extkey.child_num = 0;
  extkey.hash160[0] = '\0';
  extkey.hash160[1] = '\0';
  extkey.hash160[2] = '\0';
  extkey.hash160[3] = '\0';
  extkey.priv_key[9] = '\0';
  extkey.priv_key[10] = '\0';
  extkey.priv_key[0xb] = '\0';
  extkey.priv_key[0xc] = '\0';
  extkey.priv_key[0xd] = '\0';
  extkey.priv_key[0xe] = '\0';
  extkey.priv_key[0xf] = '\0';
  extkey.priv_key[0x10] = '\0';
  extkey.priv_key[0x11] = '\0';
  extkey.priv_key[0x12] = '\0';
  extkey.priv_key[0x13] = '\0';
  extkey.priv_key[0x14] = '\0';
  extkey.priv_key[0x15] = '\0';
  extkey.priv_key[0x16] = '\0';
  extkey.priv_key[0x17] = '\0';
  extkey.priv_key[0x18] = '\0';
  extkey.pad1[3] = '\0';
  extkey.pad1[4] = '\0';
  extkey.pad1[5] = '\0';
  extkey.pad1[6] = '\0';
  extkey.pad1[7] = '\0';
  extkey.pad1[8] = '\0';
  extkey.pad1[9] = '\0';
  extkey.priv_key[0] = '\0';
  extkey.priv_key[1] = '\0';
  extkey.priv_key[2] = '\0';
  extkey.priv_key[3] = '\0';
  extkey.priv_key[4] = '\0';
  extkey.priv_key[5] = '\0';
  extkey.priv_key[6] = '\0';
  extkey.priv_key[7] = '\0';
  extkey.priv_key[8] = '\0';
  extkey.parent160[8] = '\0';
  extkey.parent160[9] = '\0';
  extkey.parent160[10] = '\0';
  extkey.parent160[0xb] = '\0';
  extkey.parent160[0xc] = '\0';
  extkey.parent160[0xd] = '\0';
  extkey.parent160[0xe] = '\0';
  extkey.parent160[0xf] = '\0';
  extkey.parent160[0x10] = '\0';
  extkey.parent160[0x11] = '\0';
  extkey.parent160[0x12] = '\0';
  extkey.parent160[0x13] = '\0';
  extkey.depth = '\0';
  extkey.pad1[0] = '\0';
  extkey.pad1[1] = '\0';
  extkey.pad1[2] = '\0';
  extkey.chain_code[0x18] = '\0';
  extkey.chain_code[0x19] = '\0';
  extkey.chain_code[0x1a] = '\0';
  extkey.chain_code[0x1b] = '\0';
  extkey.chain_code[0x1c] = '\0';
  extkey.chain_code[0x1d] = '\0';
  extkey.chain_code[0x1e] = '\0';
  extkey.chain_code[0x1f] = '\0';
  extkey.parent160[0] = '\0';
  extkey.parent160[1] = '\0';
  extkey.parent160[2] = '\0';
  extkey.parent160[3] = '\0';
  extkey.parent160[4] = '\0';
  extkey.parent160[5] = '\0';
  extkey.parent160[6] = '\0';
  extkey.parent160[7] = '\0';
  extkey.chain_code[8] = '\0';
  extkey.chain_code[9] = '\0';
  extkey.chain_code[10] = '\0';
  extkey.chain_code[0xb] = '\0';
  extkey.chain_code[0xc] = '\0';
  extkey.chain_code[0xd] = '\0';
  extkey.chain_code[0xe] = '\0';
  extkey.chain_code[0xf] = '\0';
  extkey.chain_code[0x10] = '\0';
  extkey.chain_code[0x11] = '\0';
  extkey.chain_code[0x12] = '\0';
  extkey.chain_code[0x13] = '\0';
  extkey.chain_code[0x14] = '\0';
  extkey.chain_code[0x15] = '\0';
  extkey.chain_code[0x16] = '\0';
  extkey.chain_code[0x17] = '\0';
  uStack_2c8 = 0;
  extkey.chain_code[0] = '\0';
  extkey.chain_code[1] = '\0';
  extkey.chain_code[2] = '\0';
  extkey.chain_code[3] = '\0';
  extkey.chain_code[4] = '\0';
  extkey.chain_code[5] = '\0';
  extkey.chain_code[6] = '\0';
  extkey.chain_code[7] = '\0';
  local_2cc = bip32_key_from_parent(__dest,local_30,1,&stack0xfffffffffffffd38);
  if (local_2cc != 0) {
    local_2e8.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_hdwallet.cpp"
                 ,0x2f);
    local_2e8.filename = local_2e8.filename + 1;
    local_2e8.line = 0x359;
    local_2e8.funcname = "ExtPubkey";
    logger::warn<int&>(&local_2e8,"bip32_key_from_parent error. ret={}",&local_2cc);
    data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_308,"ExtPubkey generatekey error.",
               (allocator *)
               ((long)&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,&local_308);
    data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ::std::allocator<unsigned_char>::allocator(&local_329);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_328,0x4e,&local_329);
  ::std::allocator<unsigned_char>::~allocator(&local_329);
  puVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_328);
  sVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_328);
  local_2cc = bip32_key_serialize(&stack0xfffffffffffffd38,1,puVar3,sVar4);
  if (local_2cc != 0) {
    local_348.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_hdwallet.cpp"
                 ,0x2f);
    local_348.filename = local_348.filename + 1;
    local_348.line = 0x362;
    local_348.funcname = "ExtPubkey";
    logger::warn<int&>(&local_348,"bip32_key_serialize error. ret={}",&local_2cc);
    local_36a = 1;
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_368,"ExtPrivkey serialize error.",&local_369);
    CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,&local_368);
    local_36a = 0;
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ByteData::ByteData(&local_388,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_328);
  ByteData::operator=(&this->serialize_data_,&local_388);
  ByteData::~ByteData(&local_388);
  ByteData256::ByteData256(&local_3a0);
  ByteData256::operator=(&this->tweak_sum_,&local_3a0);
  ByteData256::~ByteData256(&local_3a0);
  AnalyzeBip32KeyData(&stack0xfffffffffffffd38,(string *)0x0,
                      (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0,&this->version_,
                      &this->depth_,&this->child_num_,&this->chaincode_,(Privkey *)0x0,
                      &this->pubkey_,&this->fingerprint_);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_328);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1e8);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1b8);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_188);
  Pubkey::~Pubkey((Pubkey *)local_98);
  return;
}

Assistant:

ExtPubkey::ExtPubkey(
    NetType network_type, const Pubkey& parent_key,
    const ByteData256& parent_chain_code, uint8_t parent_depth,
    uint32_t child_num) {
  if (!parent_key.IsValid()) {
    warn(CFD_LOG_SOURCE, "invalid pubkey.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Failed to pubkey. ExtPubkey invalid pubkey.");
  }
  Pubkey key = parent_key;
  if (!key.IsCompress()) {
    key = key.Compress();
  }

  // create simple parent data
  struct ext_key parent = {};
  memset(&parent, 0, sizeof(parent));
  parent.version = kVersionTestnetPubkey;
  if ((network_type == NetType::kMainnet) ||
      (network_type == NetType::kLiquidV1)) {
    parent.version = kVersionMainnetPubkey;
  }
  parent.depth = parent_depth;
  parent.priv_key[0] = BIP32_FLAG_KEY_PUBLIC;
  std::vector<uint8_t> pubkey_bytes = key.GetData().GetBytes();
  std::vector<uint8_t> pubkey_hash = HashUtil::Hash160(key).GetBytes();
  std::vector<uint8_t> chain_bytes = parent_chain_code.GetData().GetBytes();
  memcpy(parent.pub_key, pubkey_bytes.data(), pubkey_bytes.size());
  memcpy(parent.hash160, pubkey_hash.data(), pubkey_hash.size());
  memcpy(parent.chain_code, chain_bytes.data(), chain_bytes.size());

  struct ext_key extkey = {};
  memset(&extkey, 0, sizeof(extkey));
  int ret = bip32_key_from_parent(
      &parent, child_num, BIP32_FLAG_KEY_PUBLIC, &extkey);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "bip32_key_from_parent error. ret={}", ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "ExtPubkey generatekey error.");
  }

  std::vector<uint8_t> data(BIP32_SERIALIZED_LEN);
  ret = bip32_key_serialize(
      &extkey, BIP32_FLAG_KEY_PUBLIC, data.data(), data.size());
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "bip32_key_serialize error. ret={}", ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "ExtPrivkey serialize error.");
  }
  serialize_data_ = ByteData(data);
  tweak_sum_ = ByteData256();

  AnalyzeBip32KeyData(
      &extkey, nullptr, nullptr, &version_, &depth_, &child_num_, &chaincode_,
      nullptr, &pubkey_, &fingerprint_);
}